

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O0

bool nuraft::raft_server::get_stat_histogram
               (string *name,
               map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
               *histogram_out)

{
  bool bVar1;
  Type TVar2;
  uint64_t uVar3;
  map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  *this;
  unsigned_long *in_RSI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_unsigned_long>_>::value,_pair<iterator,_bool>_>
  _Var4;
  uint64_t cnt;
  HistItr *entry;
  iterator __end1;
  iterator __begin1;
  Histogram *__range1;
  stat_elem *elem;
  unsigned_long *__y;
  _Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff79;
  Histogram *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffb0;
  stat_mgr *in_stack_ffffffffffffffb8;
  HistItr local_40;
  Histogram *local_28;
  stat_elem *local_20;
  unsigned_long *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  stat_mgr::get_instance();
  local_20 = stat_mgr::get_stat(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (local_20 == (stat_elem *)0x0) {
    local_1 = false;
  }
  else {
    TVar2 = stat_elem::get_type(local_20);
    if (TVar2 == HISTOGRAM) {
      local_28 = stat_elem::get_histogram(local_20);
      Histogram::begin(in_stack_ffffffffffffff98);
      Histogram::end((Histogram *)in_stack_ffffffffffffff70._M_node);
      while( true ) {
        bVar1 = HistItr::operator!=(&local_40,(HistItr *)&stack0xffffffffffffffa8);
        if (!bVar1) break;
        HistItr::operator*(&local_40);
        uVar3 = HistItr::getCount((HistItr *)0x3431f0);
        if (uVar3 != 0) {
          __y = local_18;
          this = (map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                  *)HistItr::getUpperBound
                              ((HistItr *)
                               CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
          std::make_pair<unsigned_long,unsigned_long&>
                    ((unsigned_long *)in_stack_ffffffffffffff70._M_node,__y);
          _Var4 = std::
                  map<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                  ::insert<std::pair<unsigned_long,unsigned_long>>
                            (this,(pair<unsigned_long,_unsigned_long> *)
                                  CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
          in_stack_ffffffffffffff70 = _Var4.first._M_node;
          in_stack_ffffffffffffff78 = _Var4.second;
        }
        HistItr::operator++(&local_40);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool raft_server::get_stat_histogram(const std::string& name,
                                     std::map<double, uint64_t>& histogram_out ) {
    stat_elem* elem = stat_mgr::get_instance()->get_stat(name);
    if (!elem) return false;
    if (elem->get_type() != stat_elem::HISTOGRAM) return false;

    for (HistItr& entry: *elem->get_histogram()) {
        uint64_t cnt = entry.getCount();
        if (cnt) {
            histogram_out.insert( std::make_pair(entry.getUpperBound(), cnt) );
        }
    }
    return true;
}